

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O2

void __thiscall wabt::AST::PreDecl<(wabt::ExprType)21>(AST *this,VarExpr<(wabt::ExprType)21> *ve)

{
  pointer pNVar1;
  __type _Var2;
  string *__lhs;
  string *__rhs;
  Node *n;
  pointer pNVar3;
  ExprType local_40;
  NodeType local_3c;
  Var *local_38;
  void *local_30;
  
  pNVar3 = (this->predecls).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  pNVar1 = (this->predecls).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_38 = &ve->var;
  do {
    if (pNVar3 == pNVar1) {
      local_3c = Decl;
      local_30 = (void *)0x0;
      local_40 = Nop;
      std::vector<wabt::Node,std::allocator<wabt::Node>>::
      emplace_back<wabt::NodeType,wabt::ExprType,decltype(nullptr),wabt::Var_const*>
                ((vector<wabt::Node,std::allocator<wabt::Node>> *)&this->predecls,&local_3c,
                 &local_40,&local_30,&local_38);
      return;
    }
    __lhs = Var::name_abi_cxx11_((pNVar3->u).var);
    __rhs = Var::name_abi_cxx11_(local_38);
    _Var2 = std::operator==(__lhs,__rhs);
    pNVar3 = pNVar3 + 1;
  } while (!_Var2);
  return;
}

Assistant:

void PreDecl(const VarExpr<T>& ve) {
    // FIXME: this is slow, and would be better to avoid in callers.
    // See https://github.com/WebAssembly/wabt/issues/1565
    // And https://github.com/WebAssembly/wabt/issues/1665
    for (auto& n : predecls) {
      if (n.u.var->name() == ve.var.name()) {
        return;
      }
    }
    predecls.emplace_back(NodeType::Decl, ExprType::Nop, nullptr, &ve.var);
  }